

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall
pbrt::QuadMesh::getPrimBounds(box3f *__return_storage_ptr__,QuadMesh *this,size_t primID)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pvVar6;
  pointer pvVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  auVar11 = _DAT_0014a350;
  uVar8 = DAT_0014a350;
  (__return_storage_ptr__->upper).y = (float)(int)uVar8;
  (__return_storage_ptr__->upper).z = (float)(int)((ulong)uVar8 >> 0x20);
  pvVar6 = (this->vertex).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (this->index).super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2._0_4_ = pvVar6[pvVar7[primID].x].x;
  uVar2._4_4_ = pvVar6[pvVar7[primID].x].y;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar2;
  auVar13 = minps(auVar13,_DAT_0014e7a0);
  fVar17 = pvVar6[pvVar7[primID].x].z;
  fVar16 = fVar17;
  if (3.4028235e+38 <= fVar17) {
    fVar16 = 3.4028235e+38;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar13._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar13._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar16;
  auVar11 = maxps(auVar19,auVar11);
  if (fVar17 <= -3.4028235e+38) {
    fVar17 = -3.4028235e+38;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar11._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar17;
  uVar3._0_4_ = pvVar6[pvVar7[primID].y].x;
  uVar3._4_4_ = pvVar6[pvVar7[primID].y].y;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar3;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar3;
  auVar19 = minps(auVar18,auVar13);
  fVar1 = pvVar6[pvVar7[primID].y].z;
  fVar20 = fVar1;
  if (fVar16 <= fVar1) {
    fVar20 = fVar16;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar19._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar19._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar20;
  auVar11 = maxps(auVar9,auVar11);
  if (fVar1 <= fVar17) {
    fVar1 = fVar17;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar11._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar1;
  uVar4._0_4_ = pvVar6[pvVar7[primID].z].x;
  uVar4._4_4_ = pvVar6[pvVar7[primID].z].y;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar4;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar4;
  auVar19 = minps(auVar15,auVar19);
  fVar17 = pvVar6[pvVar7[primID].z].z;
  fVar16 = fVar17;
  if (fVar20 <= fVar17) {
    fVar16 = fVar20;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar19._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar19._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar16;
  auVar11 = maxps(auVar12,auVar11);
  if (fVar17 <= fVar1) {
    fVar17 = fVar1;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar11._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar17;
  uVar5._0_4_ = pvVar6[pvVar7[primID].w].x;
  uVar5._4_4_ = pvVar6[pvVar7[primID].w].y;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar5;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar5;
  auVar19 = minps(auVar14,auVar19);
  fVar1 = pvVar6[pvVar7[primID].w].z;
  fVar20 = fVar1;
  if (fVar16 <= fVar1) {
    fVar20 = fVar16;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar19._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar19._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar20;
  auVar11 = maxps(auVar10,auVar11);
  if (fVar1 <= fVar17) {
    fVar1 = fVar17;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar11._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar1;
  return __return_storage_ptr__;
}

Assistant:

box3f QuadMesh::getPrimBounds(const size_t primID) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(vertex[index[primID].x]);
    primBounds.extend(vertex[index[primID].y]);
    primBounds.extend(vertex[index[primID].z]);
    primBounds.extend(vertex[index[primID].w]);
    return primBounds;
  }